

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imu-fixed-contact-dynamical-system.cpp
# Opt level: O0

Vector __thiscall
stateObservation::flexibilityEstimation::IMUFixedContactDynamicalSystem::stateDynamics
          (IMUFixedContactDynamicalSystem *this,Vector *x,Vector *param_2,TimeIndex param_3)

{
  Index *__return_storage_ptr__;
  double *pdVar1;
  Scalar *scalar;
  StorageBaseType *matrix;
  Index extraout_RDX;
  Vector VVar2;
  Type local_380;
  Type local_348;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_310;
  undefined1 local_2e8 [8];
  AngleAxis orientationAA;
  Type local_280;
  undefined1 local_248 [8];
  Vector xk1;
  Quaternion orientationFlex;
  Type local_210;
  Matrix<double,3,1,0,3,1> local_1d8 [8];
  Vector3 angularAccelerationFlex;
  Matrix<double,3,1,0,3,1> local_188 [8];
  Vector3 angularVelocityFlex;
  Matrix<double,3,1,0,3,1> local_138 [8];
  Vector3 orientationFlexV;
  Matrix<double,3,1,0,3,1> local_e8 [8];
  Vector3 accelerationFlex;
  Matrix<double,3,1,0,3,1> local_98 [8];
  Vector3 velocityFlex;
  Matrix<double,3,1,0,3,1> local_48 [8];
  Vector3 positionFlex;
  TimeIndex param_3_local;
  Vector *param_2_local;
  Vector *x_local;
  IMUFixedContactDynamicalSystem *this_local;
  
  DynamicalSystemFunctorBase::assertStateVector_((DynamicalSystemFunctorBase *)x,param_2);
  pdVar1 = velocityFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
           m_data.array + 2;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
            ((Type *)pdVar1,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)param_2,0,3);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::VectorBlock<Eigen::Matrix<double,_1,1,0,_1,1>const,_1>>
            (local_48,(VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)pdVar1);
  pdVar1 = accelerationFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
           m_data.array + 2;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
            ((Type *)pdVar1,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)param_2,6,3);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::VectorBlock<Eigen::Matrix<double,_1,1,0,_1,1>const,_1>>
            (local_98,(VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)pdVar1);
  pdVar1 = orientationFlexV.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
           m_data.array + 2;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
            ((Type *)pdVar1,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)param_2,0xc,3);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::VectorBlock<Eigen::Matrix<double,_1,1,0,_1,1>const,_1>>
            (local_e8,(VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)pdVar1);
  pdVar1 = angularVelocityFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
           m_storage.m_data.array + 2;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
            ((Type *)pdVar1,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)param_2,3,3);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::VectorBlock<Eigen::Matrix<double,_1,1,0,_1,1>const,_1>>
            (local_138,(VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)pdVar1);
  pdVar1 = angularAccelerationFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
           m_storage.m_data.array + 2;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
            ((Type *)pdVar1,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)param_2,9,3);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::VectorBlock<Eigen::Matrix<double,_1,1,0,_1,1>const,_1>>
            (local_188,(VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)pdVar1);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
            (&local_210,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)param_2,0xf,3);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::VectorBlock<Eigen::Matrix<double,_1,1,0,_1,1>const,_1>>(local_1d8,&local_210);
  __return_storage_ptr__ =
       &xk1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  computeQuaternion_((Quaternion *)__return_storage_ptr__,(IMUFixedContactDynamicalSystem *)x,
                     (Vector3 *)local_138);
  kine::integrateKinematics
            ((Vector3 *)local_48,(Vector3 *)local_98,(Vector3 *)local_e8,
             (Quaternion *)__return_storage_ptr__,(Vector3 *)local_188,(Vector3 *)local_1d8,
             (double)x[0x12].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_rows);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)local_248,param_2);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
            (&local_280,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_248,0,3);
  Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>::operator=
            ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false> *)&local_280,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_48);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
            ((Type *)&orientationAA.m_angle,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_248,6,3);
  Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>::operator=
            ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false> *)&orientationAA.m_angle,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_98);
  Eigen::AngleAxis<double>::AngleAxis<Eigen::Quaternion<double,0>>
            ((AngleAxis<double> *)local_2e8,
             (QuaternionBase<Eigen::Quaternion<double,_0>_> *)
             &xk1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  scalar = Eigen::AngleAxis<double>::angle((AngleAxis<double> *)local_2e8);
  matrix = (StorageBaseType *)Eigen::AngleAxis<double>::axis((AngleAxis<double> *)local_2e8);
  Eigen::operator*(&local_310,scalar,matrix);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            (local_138,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_310);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
            (&local_348,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_248,3,3);
  Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>::operator=
            ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false> *)&local_348,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_138);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
            (&local_380,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_248,9,3);
  Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>::operator=
            ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false> *)&local_380,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_188);
  if (x[0x12].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data ==
      (double *)0x0) {
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
              ((Matrix<double,__1,_1,_0,__1,_1> *)this,(Matrix<double,__1,_1,_0,__1,_1> *)local_248)
    ;
  }
  else {
    pdVar1 = x[0x12].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
    ;
    (**(code **)((long)*pdVar1 + 0x10))(this,pdVar1,local_248);
  }
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_248);
  VVar2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  VVar2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (Vector)VVar2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Vector IMUFixedContactDynamicalSystem::stateDynamics(const Vector & x, const Vector &, TimeIndex)
{
  assertStateVector_(x);

  Vector3 positionFlex(x.segment(indexes::pos, 3));
  Vector3 velocityFlex(x.segment(indexes::linVel, 3));
  Vector3 accelerationFlex(x.segment(indexes::linAcc, 3));

  Vector3 orientationFlexV(x.segment(indexes::ori, 3));
  Vector3 angularVelocityFlex(x.segment(indexes::angVel, 3));
  Vector3 angularAccelerationFlex(x.segment(indexes::angAcc, 3));

  Quaternion orientationFlex(computeQuaternion_(orientationFlexV));

  kine::integrateKinematics(positionFlex, velocityFlex, accelerationFlex, orientationFlex, angularVelocityFlex,
                            angularAccelerationFlex, dt_);

  // x_{k+1}
  Vector xk1(x);

  xk1.segment(indexes::pos, 3) = positionFlex;
  xk1.segment(indexes::linVel, 3) = velocityFlex;

  AngleAxis orientationAA(orientationFlex);
  orientationFlexV = orientationAA.angle() * orientationAA.axis();

  xk1.segment(indexes::ori, 3) = orientationFlexV;
  xk1.segment(indexes::angVel, 3) = angularVelocityFlex;

  if(processNoise_ != 0x0)
    return processNoise_->getNoisy(xk1);
  else
    return xk1;
}